

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O1

string * __thiscall
cmdline::parser::option_with_value<unsigned_int>::full_description
          (string *__return_storage_ptr__,option_with_value<unsigned_int> *this,string *desc)

{
  bool bVar1;
  pointer pcVar2;
  long lVar3;
  undefined8 *puVar4;
  long *plVar5;
  long *plVar6;
  ulong *puVar7;
  size_type *psVar8;
  ulong uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ulong *local_110;
  long local_108;
  ulong local_100;
  long lStack_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  long *local_d0;
  undefined8 local_c8;
  long local_c0;
  undefined8 uStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  uint local_4c;
  string local_48;
  
  pcVar2 = (desc->_M_dataplus)._M_p;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar2,pcVar2 + desc->_M_string_length);
  std::__cxx11::string::append((char *)&local_b0);
  detail::readable_typename<unsigned_int>();
  uVar9 = 0xf;
  if (local_b0 != local_a0) {
    uVar9 = local_a0[0];
  }
  if (uVar9 < (ulong)(local_88 + local_a8)) {
    uVar9 = 0xf;
    if (local_90 != local_80) {
      uVar9 = local_80[0];
    }
    if (uVar9 < (ulong)(local_88 + local_a8)) goto LAB_0011092a;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_b0);
  }
  else {
LAB_0011092a:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90);
  }
  local_f0 = &local_e0;
  puVar7 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar7) {
    local_e0 = *puVar7;
    uStack_d8 = *(undefined4 *)(puVar4 + 3);
    uStack_d4 = *(undefined4 *)((long)puVar4 + 0x1c);
  }
  else {
    local_e0 = *puVar7;
    local_f0 = (ulong *)*puVar4;
  }
  local_e8 = puVar4[1];
  *puVar4 = puVar7;
  puVar4[1] = 0;
  *(undefined1 *)puVar7 = 0;
  bVar1 = this->need;
  if (bVar1 == true) {
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
  }
  else {
    local_4c = this->def;
    detail::
    lexical_cast_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_false>
    ::cast(&local_48,&local_4c);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x117316);
    local_70 = &local_60;
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar5[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar5;
    }
    local_68 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_110 = &local_100;
    puVar7 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar7) {
      local_100 = *puVar7;
      lStack_f8 = plVar5[3];
    }
    else {
      local_100 = *puVar7;
      local_110 = (ulong *)*plVar5;
    }
    local_108 = plVar5[1];
    *plVar5 = (long)puVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
  }
  uVar9 = 0xf;
  if (local_f0 != &local_e0) {
    uVar9 = local_e0;
  }
  if (uVar9 < (ulong)(local_108 + local_e8)) {
    uVar9 = 0xf;
    if (local_110 != &local_100) {
      uVar9 = local_100;
    }
    if ((ulong)(local_108 + local_e8) <= uVar9) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_f0);
      goto LAB_00110b04;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_110);
LAB_00110b04:
  local_d0 = &local_c0;
  plVar5 = puVar4 + 2;
  if ((long *)*puVar4 == plVar5) {
    local_c0 = *plVar5;
    uStack_b8 = puVar4[3];
  }
  else {
    local_c0 = *plVar5;
    local_d0 = (long *)*puVar4;
  }
  local_c8 = puVar4[1];
  *puVar4 = plVar5;
  puVar4[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar8) {
    lVar3 = plVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (bVar1 == false) {
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string full_description(const std::string &desc){
      return
        desc+" ("+detail::readable_typename<T>()+
        (need?"":" [="+detail::default_value<T>(def)+"]")
        +")";
    }